

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool P_HitWater(AActor *thing,sector_t *sec,DVector3 *pos,bool checkabove,bool alert,bool force)

{
  int iVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  FTerrainDef *pFVar4;
  FSplashDef *pFVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  sector_t_conflict *psVar10;
  ulong uVar11;
  AActor *ent;
  ulong uVar12;
  sector_t *psVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  FSoundID local_38;
  FSoundID local_34;
  
  if (((thing->flags3).Value & 0x40) != 0) {
    return false;
  }
  if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) {
    if (checkabove) {
      dVar16 = thing->Height * 0.5 + (thing->__Pos).Z;
      if (((thing->flags).Value & 0x10000) != 0) {
        dVar16 = dVar16 - (thing->Vel).Z;
      }
      if (dVar16 < pos->Z) goto LAB_004275fe;
    }
    if (force) {
      psVar10 = sector_t::GetHeightSec((sector_t_conflict *)sec);
      bVar15 = psVar10 == (sector_t_conflict *)0x0;
      psVar10 = (sector_t_conflict *)sec;
    }
    else {
      uVar11 = (ulong)(sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar11 != 0) {
        dVar16 = pos->Z;
        uVar12 = 0;
        do {
          pFVar2 = (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar12];
          if ((pFVar2->flags & 1) != 0) {
            psVar3 = (pFVar2->top).plane;
            dVar17 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                     psVar3->negiC;
            if ((((pFVar2->flags & 0x12) != 0) && (dVar17 + -0.5 < dVar16)) &&
               (dVar16 < dVar17 + 0.5)) {
              iVar7 = sector_t::GetTerrain
                                ((sector_t_conflict *)pFVar2->model,(pFVar2->top).isceiling);
              bVar15 = true;
              goto LAB_00427363;
            }
            psVar3 = (pFVar2->bottom).plane;
            dVar17 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                     psVar3->negiC;
            if ((dVar17 < dVar16) && (thing->floorz <= dVar17)) goto LAB_004275fe;
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      psVar10 = sector_t::GetHeightSec((sector_t_conflict *)sec);
      if (psVar10 == (sector_t_conflict *)0x0) {
        bVar15 = true;
        psVar10 = (sector_t_conflict *)sec;
      }
      else if ((psVar10->MoreFlags & 4) == 0) {
        bVar15 = false;
        psVar10 = (sector_t_conflict *)sec;
      }
      else {
        bVar15 = false;
      }
    }
    iVar7 = sector_t::GetTerrain(psVar10,0);
LAB_00427363:
    pFVar5 = Splashes.Array;
    pFVar4 = Terrains.Array + iVar7;
    lVar14 = (long)pFVar4->Splash;
    if ((lVar14 != -1) && ((thing->waterlevel < 1 || (thing->floorz < pos->Z)))) {
      psVar13 = sec;
      if (!bVar15) {
        psVar13 = sec->heightsec;
      }
      if (((((thing->flags3).Value & 0x2000) == 0) && (thing->player == (player_t *)0x0)) ||
         ((thing->Vel).Z < -6.0 || force)) {
        iVar1 = thing->Mass;
        if ((iVar1 < 10) && (Splashes.Array[lVar14].SmallSplash != (PClassActor *)0x0)) {
          ent = AActor::StaticSpawn(Splashes.Array[lVar14].SmallSplash,pos,ALLOW_REPLACE,false);
          if (ent == (AActor *)0x0) goto LAB_004275ba;
          ent->Floorclip = pFVar5[lVar14].SmallSplashClip + ent->Floorclip;
LAB_00427587:
          local_34.ID = (&pFVar5[lVar14].SmallSplashSound)[9 < iVar1].ID;
          S_Sound(ent,3,&local_34,1.0,1.001);
        }
        else {
          if (Splashes.Array[lVar14].SplashChunk == (PClassActor *)0x0) {
            ent = (AActor *)0x0;
          }
          else {
            ent = AActor::StaticSpawn(Splashes.Array[lVar14].SplashChunk,pos,ALLOW_REPLACE,false);
            (ent->target).field_0.p = thing;
            if (pFVar5[lVar14].ChunkXVelShift != 0xff) {
              iVar8 = FRandom::Random2(&pr_chunk);
              (ent->Vel).X = (double)(iVar8 << (pFVar5[lVar14].ChunkXVelShift & 0x1f)) *
                             1.52587890625e-05;
            }
            if (pFVar5[lVar14].ChunkYVelShift != 0xff) {
              iVar8 = FRandom::Random2(&pr_chunk);
              (ent->Vel).Y = (double)(iVar8 << (pFVar5[lVar14].ChunkYVelShift & 0x1f)) *
                             1.52587890625e-05;
            }
            dVar16 = pFVar5[lVar14].ChunkBaseZVel;
            uVar9 = FRandom::GenRand32(&pr_chunk);
            (ent->Vel).Z = (double)(int)((uVar9 & 0xff) << (pFVar5[lVar14].ChunkZVelShift & 0x1f)) *
                           1.52587890625e-05 + dVar16;
          }
          if (pFVar5[lVar14].SplashBase != (PClassActor *)0x0) {
            ent = AActor::StaticSpawn(pFVar5[lVar14].SplashBase,pos,ALLOW_REPLACE,false);
          }
          if (((thing->player != (player_t *)0x0) && (alert)) && (pFVar5[lVar14].NoAlert == false))
          {
            P_NoiseAlert(thing,thing,true,0.0);
          }
          if (ent != (AActor *)0x0) goto LAB_00427587;
LAB_004275ba:
          local_38.ID = (&pFVar5[lVar14].SmallSplashSound)[9 < iVar1].ID;
          S_Sound(pos,3,&local_38,1.0,1.001);
        }
        if (psVar13 != sec) goto LAB_004275fe;
        pFVar4 = Terrains.Array + iVar7;
      }
    }
    uVar6 = pFVar4->IsLiquid;
  }
  else {
LAB_004275fe:
    uVar6 = 0;
  }
  return (bool)uVar6;
}

Assistant:

bool P_HitWater (AActor * thing, sector_t * sec, const DVector3 &pos, bool checkabove, bool alert, bool force)
{
	if (thing->flags3 & MF3_DONTSPLASH)
		return false;

	if (thing->player && (thing->player->cheats & CF_PREDICTING))
		return false;

	AActor *mo = NULL;
	FSplashDef *splash;
	int terrainnum;
	sector_t *hsec = NULL;
	
	// don't splash above the object
	if (checkabove)
	{
		double compare_z = thing->Center();
		// Missiles are typically small and fast, so they might
		// end up submerged by the move that calls P_HitWater.
		if (thing->flags & MF_MISSILE)
			compare_z -= thing->Vel.Z;
		if (pos.Z > compare_z) 
			return false;
	}

#if 0 // needs some rethinking before activation

	// This avoids spawning splashes on invisible self referencing sectors.
	// For network consistency do this only in single player though because
	// it is not guaranteed that all players have GL nodes loaded.
	if (!multiplayer && thing->subsector->sector != thing->subsector->render_sector)
	{
		double zs = thing->subsector->sector->floorplane.ZatPoint(pos);
		double zr = thing->subsector->render_sector->floorplane.ZatPoint(pos);

		if (zs > zr && thing->Z() >= zs) return false;
	}
#endif

	// 'force' means, we want this sector's terrain, no matter what.
	if (!force)
	{
		for (unsigned int i = 0; i<sec->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor * rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			double planez = rover->top.plane->ZatPoint(pos);
				if (pos.Z > planez - 0.5 && pos.Z < planez + 0.5)	// allow minor imprecisions
			{
				if (rover->flags & (FF_SOLID | FF_SWIMMABLE))
				{
					terrainnum = rover->model->GetTerrain(rover->top.isceiling);
					goto foundone;
				}
			}
			planez = rover->bottom.plane->ZatPoint(pos);
			if (planez < pos.Z && !(planez < thing->floorz)) return false;
		}
	}
	hsec = sec->GetHeightSec();
	if (force || hsec == NULL || !(hsec->MoreFlags & SECF_CLIPFAKEPLANES))
	{
		terrainnum = sec->GetTerrain(sector_t::floor);
	}
	else
	{
		terrainnum = hsec->GetTerrain(sector_t::floor);
	}
foundone:

	int splashnum = Terrains[terrainnum].Splash;
	bool smallsplash = false;
	const secplane_t *plane;

	if (splashnum == -1)
		return Terrains[terrainnum].IsLiquid;

	// don't splash when touching an underwater floor
	if (thing->waterlevel >= 1 && pos.Z <= thing->floorz) return Terrains[terrainnum].IsLiquid;

	plane = hsec != NULL? &sec->heightsec->floorplane : &sec->floorplane;

	// Don't splash for living things with small vertical velocities.
	// There are levels where the constant splashing from the monsters gets extremely annoying
	if (((thing->flags3&MF3_ISMONSTER || thing->player) && thing->Vel.Z >= -6) && !force)
		return Terrains[terrainnum].IsLiquid;

	splash = &Splashes[splashnum];

	// Small splash for small masses
	if (thing->Mass < 10)
		smallsplash = true;

	if (smallsplash && splash->SmallSplash)
	{
		mo = Spawn (splash->SmallSplash, pos, ALLOW_REPLACE);
		if (mo) mo->Floorclip += splash->SmallSplashClip;
	}
	else
	{
		if (splash->SplashChunk)
		{
			mo = Spawn (splash->SplashChunk, pos, ALLOW_REPLACE);
			mo->target = thing;
			if (splash->ChunkXVelShift != 255)
			{
				mo->Vel.X = (pr_chunk.Random2() << splash->ChunkXVelShift) / 65536.;
			}
			if (splash->ChunkYVelShift != 255)
			{
				mo->Vel.Y = (pr_chunk.Random2() << splash->ChunkYVelShift) / 65536.;
			}
			mo->Vel.Z = splash->ChunkBaseZVel + (pr_chunk() << splash->ChunkZVelShift) / 65536.;
		}
		if (splash->SplashBase)
		{
			mo = Spawn (splash->SplashBase, pos, ALLOW_REPLACE);
		}
		if (thing->player && !splash->NoAlert && alert)
		{
			P_NoiseAlert (thing, thing, true);
		}
	}
	if (mo)
	{
		S_Sound (mo, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}
	else
	{
		S_Sound (pos, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}

	// Don't let deep water eat missiles
	return plane == &sec->floorplane ? Terrains[terrainnum].IsLiquid : false;
}